

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O2

void opj_dwt_calc_explicit_stepsizes(opj_tccp_t *tccp,OPJ_UINT32 prec)

{
  OPJ_UINT32 OVar1;
  int iVar2;
  OPJ_INT32 l;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  double dVar7;
  
  OVar1 = tccp->numresolutions;
  for (uVar6 = 0; uVar6 != OVar1 * 3 - 2; uVar6 = uVar6 + 1) {
    if (uVar6 == 0) {
      uVar4 = 0;
      uVar3 = 0;
    }
    else {
      uVar3 = (int)uVar6 - 1;
      uVar4 = ~(uVar3 / 3);
      uVar3 = uVar3 % 3 + 1;
    }
    iVar2 = 2 - (uint)(uVar3 - 1 < 2);
    if (uVar3 == 0) {
      iVar2 = 0;
    }
    if (tccp->qmfbid == 0) {
      iVar2 = 0;
    }
    dVar7 = 8192.0;
    if (tccp->qntsty != 0) {
      dVar7 = ((double)(1 << ((byte)iVar2 & 0x1f)) /
              (double)opj_dwt_norms_real[uVar3][uVar4 + (OVar1 - 1)]) * 8192.0;
    }
    dVar7 = floor(dVar7);
    uVar3 = 0;
    uVar5 = (uint)dVar7;
    for (uVar4 = uVar5; 1 < (int)uVar4; uVar4 = uVar4 >> 1) {
      uVar3 = uVar3 + 1;
    }
    uVar4 = uVar5 << (0xbU - (char)uVar3 & 0x1f);
    if (0xb < uVar3) {
      uVar4 = (int)uVar5 >> ((char)uVar3 - 0xbU & 0x1f);
    }
    tccp->stepsizes[uVar6].mant = uVar4 & 0x7ff;
    tccp->stepsizes[uVar6].expn = (iVar2 + prec + 0xd) - uVar3;
  }
  return;
}

Assistant:

void opj_dwt_calc_explicit_stepsizes(opj_tccp_t * tccp, OPJ_UINT32 prec) {
	OPJ_UINT32 numbands, bandno;
	numbands = 3 * tccp->numresolutions - 2;
	for (bandno = 0; bandno < numbands; bandno++) {
		OPJ_FLOAT64 stepsize;
		OPJ_UINT32 resno, level, orient, gain;

		resno = (bandno == 0) ? 0 : ((bandno - 1) / 3 + 1);
		orient = (bandno == 0) ? 0 : ((bandno - 1) % 3 + 1);
		level = tccp->numresolutions - 1 - resno;
		gain = (tccp->qmfbid == 0) ? 0 : ((orient == 0) ? 0 : (((orient == 1) || (orient == 2)) ? 1 : 2));
		if (tccp->qntsty == J2K_CCP_QNTSTY_NOQNT) {
			stepsize = 1.0;
		} else {
			OPJ_FLOAT64 norm = opj_dwt_norms_real[orient][level];
			stepsize = (1 << (gain)) / norm;
		}
		opj_dwt_encode_stepsize((OPJ_INT32) floor(stepsize * 8192.0), (OPJ_INT32)(prec + gain), &tccp->stepsizes[bandno]);
	}
}